

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

char * FindFileContentInImportPaths
                 (InplaceStr moduleName,char *moduleRoot,bool addExtension,char *resultPathBuf,
                 uint resultPathBufSize,uint *fileSize)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  uint pos;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  bVar6 = moduleRoot == (char *)0x0;
  if (bVar6) {
    moduleRoot = "";
  }
  pcVar4 = "/";
  if (bVar6) {
    pcVar4 = "";
  }
  pos = 0;
  pcVar5 = (char *)0x0;
  do {
    __s = BinaryCache::EnumImportPath(pos);
    if (__s == (char *)0x0) {
      bVar6 = false;
    }
    else {
      iVar1 = NULLC::SafeSprintf(resultPathBuf,(ulong)resultPathBufSize,"%s%s%s%.*s",__s,moduleRoot,
                                 pcVar4,(ulong)(uint)((int)moduleName.end - (int)moduleName.begin),
                                 moduleName.begin);
      if (addExtension) {
        sVar2 = strlen(__s);
        pcVar5 = resultPathBuf + sVar2;
        sVar2 = strlen(pcVar5);
        if ((int)sVar2 != 0) {
          uVar3 = 0;
          do {
            if (pcVar5[uVar3] == '.') {
              pcVar5[uVar3] = '/';
            }
            uVar3 = uVar3 + 1;
          } while ((sVar2 & 0xffffffff) != uVar3);
        }
        NULLC::SafeSprintf(resultPathBuf + iVar1,(ulong)(resultPathBufSize - iVar1),".nc");
      }
      pcVar5 = (char *)(*(code *)NULLC::fileLoad)(resultPathBuf,fileSize);
      bVar6 = pcVar5 == (char *)0x0;
    }
    pos = pos + 1;
  } while (bVar6);
  return pcVar5;
}

Assistant:

const char* FindFileContentInImportPaths(InplaceStr moduleName, const char *moduleRoot, bool addExtension, char *resultPathBuf, unsigned resultPathBufSize, unsigned &fileSize)
{
	const char *fileContent = NULL;

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = resultPathBuf + NULLC::SafeSprintf(resultPathBuf, resultPathBufSize, "%s%s%s%.*s", modulePath, moduleRoot ? moduleRoot : "", moduleRoot ? "/" : "", moduleName.length(), moduleName.begin);

		if(addExtension)
		{
			char *pathNoImport = resultPathBuf + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, resultPathBufSize - int(pathEnd - resultPathBuf), ".nc");
		}

		fileContent = NULLC::fileLoad(resultPathBuf, &fileSize);

		if(fileContent)
			break;
	}

	return fileContent;
}